

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexManager.cpp
# Opt level: O2

void __thiscall IndexManager::InsertSuchKey(IndexManager *this,IndexInfo *I,Addr p,value *v)

{
  int iVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  key_type local_e8;
  key_type local_c8;
  key_type local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_48,&this->Direction,&I->tableName);
  std::operator+(&local_88,&local_48,"_");
  std::operator+(&local_68,&local_88,&I->indexName);
  std::operator+(&bStack_128,&local_68,"_idx.dat");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  iVar1 = v->type;
  if (iVar1 == 90000) {
    std::__cxx11::string::string((string *)&local_c8,(string *)&bStack_128);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>_>_>
            ::find(&(this->BpTrees_F)._M_t,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    BpTree<float>::InsertKey((BpTree<float> *)(iVar3._M_node + 2),v->floatV,p);
  }
  else if (iVar1 == 50000) {
    std::__cxx11::string::string((string *)&local_a8,(string *)&bStack_128);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>_>_>
            ::find(&(this->BpTrees_I)._M_t,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    BpTree<int>::InsertKey((BpTree<int> *)(iVar2._M_node + 2),v->intV,p);
  }
  else if (120000 < iVar1) {
    std::__cxx11::string::string((string *)&local_e8,(string *)&bStack_128);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::find(&(this->BpTrees_S)._M_t,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::string((string *)&local_108,(string *)&v->charV);
    BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertKey((BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(iVar4._M_node + 2),&local_108,p);
    std::__cxx11::string::~string((string *)&local_108);
  }
  std::__cxx11::string::~string((string *)&bStack_128);
  return;
}

Assistant:

void IndexManager::InsertSuchKey(IndexInfo I, Addr p, value v) {
	string filename = Direction + I.tableName + "_" + I.indexName + "_idx.dat";
	if (v.type == 50000) {
		BpTree<int>& Tree = FindBpTree_I(filename);
		Tree.InsertKey(v.intV, p);
	}
	else if (v.type == 90000) {
		BpTree<float>& Tree = FindBpTree_F(filename);
		Tree.InsertKey(v.floatV, p);
	}
	else if (v.type > 120000) {
		BpTree<string>& Tree = FindBpTree_S(filename);
		Tree.InsertKey(v.charV, p);
	}
}